

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3VdbeSorterReset(sqlite3 *db,VdbeSorter *pSorter)

{
  sqlite3 *in_RSI;
  SortSubtask *pTask;
  int i;
  SortSubtask *in_stack_ffffffffffffffd8;
  sqlite3 *in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe8;
  int iVar1;
  
  vdbeSorterJoinAll((VdbeSorter *)in_RSI,-0x55555556);
  if ((PmaReader *)in_RSI->pDfltColl != (PmaReader *)0x0) {
    vdbePmaReaderClear((PmaReader *)0x171acc);
    sqlite3DbFree(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
    in_RSI->pDfltColl = (CollSeq *)0x0;
  }
  vdbeMergeEngineFree((MergeEngine *)in_stack_ffffffffffffffe0);
  in_RSI->mutex = (sqlite3_mutex *)0x0;
  for (iVar1 = 0; iVar1 < (int)(uint)*(byte *)((long)&in_RSI->errMask + 3); iVar1 = iVar1 + 1) {
    in_stack_ffffffffffffffe0 = (sqlite3 *)(in_RSI->aLimit + (long)iVar1 * 0x18 + -10);
    vdbeSortSubtaskCleanup(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
    in_stack_ffffffffffffffe0->pDfltColl = (CollSeq *)in_RSI;
  }
  if (in_RSI->szMmap == 0) {
    vdbeSorterRecordFree(in_RSI,(SorterRecord *)CONCAT44(iVar1,in_stack_ffffffffffffffe8));
  }
  in_RSI->lastRowid = 0;
  in_RSI->nSchemaLock = 0;
  in_RSI->openFlags = 0;
  *(undefined1 *)&in_RSI->errMask = 0;
  in_RSI->errCode = 0;
  *(undefined4 *)&in_RSI->pVdbe = 0;
  sqlite3DbFree(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  in_RSI->flags = 0;
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3VdbeSorterReset(sqlite3 *db, VdbeSorter *pSorter){
  int i;
  (void)vdbeSorterJoinAll(pSorter, SQLITE_OK);
  assert( pSorter->bUseThreads || pSorter->pReader==0 );
#if SQLITE_MAX_WORKER_THREADS>0
  if( pSorter->pReader ){
    vdbePmaReaderClear(pSorter->pReader);
    sqlite3DbFree(db, pSorter->pReader);
    pSorter->pReader = 0;
  }
#endif
  vdbeMergeEngineFree(pSorter->pMerger);
  pSorter->pMerger = 0;
  for(i=0; i<pSorter->nTask; i++){
    SortSubtask *pTask = &pSorter->aTask[i];
    vdbeSortSubtaskCleanup(db, pTask);
    pTask->pSorter = pSorter;
  }
  if( pSorter->list.aMemory==0 ){
    vdbeSorterRecordFree(0, pSorter->list.pList);
  }
  pSorter->list.pList = 0;
  pSorter->list.szPMA = 0;
  pSorter->bUsePMA = 0;
  pSorter->iMemory = 0;
  pSorter->mxKeysize = 0;
  sqlite3DbFree(db, pSorter->pUnpacked);
  pSorter->pUnpacked = 0;
}